

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<(anonymous_namespace)::RootPresets> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>
::
Bind<(anonymous_namespace)::RootPresets,std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>,cmCMakePresetsGraph::ReadFileResult(*)(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*)>
          (Object<(anonymous_namespace)::RootPresets> *this,string_view *name,
          offset_in_RootPresets_to_vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
          member,_func_ReadFileResult_vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>_ptr_Value_ptr
                 *func,bool required)

{
  Object<(anonymous_namespace)::RootPresets> *pOVar1;
  anon_class_16_2_47de0b2f local_60;
  MemberFunction local_50;
  byte local_29;
  _func_ReadFileResult_vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>_ptr_Value_ptr
  *p_Stack_28;
  bool required_local;
  _func_ReadFileResult_vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>_ptr_Value_ptr
  *func_local;
  offset_in_RootPresets_to_vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
  member_local;
  string_view *name_local;
  Object<(anonymous_namespace)::RootPresets> *this_local;
  
  local_60.func = func;
  local_60.member = member;
  local_29 = required;
  p_Stack_28 = func;
  func_local = (_func_ReadFileResult_vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>_ptr_Value_ptr
                *)member;
  member_local = (offset_in_RootPresets_to_vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
                  )name;
  name_local = (string_view *)this;
  std::
  function<cmCMakePresetsGraph::ReadFileResult((anonymous_namespace)::RootPresets&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Bind<(anonymous_namespace)::RootPresets,std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>,cmCMakePresetsGraph::ReadFileResult(*)(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*)>(std::basic_string_view<char,std::char_traits<char>>const&,std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>(anonymous_namespace)::RootPresets::*,cmCMakePresetsGraph::ReadFileResult(*)(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*),bool)::_lambda((anonymous_namespace)::RootPresets&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult((anonymous_namespace)::RootPresets&,Json::Value_const*)>
              *)&local_50,&local_60);
  pOVar1 = BindPrivate(this,name,&local_50,(bool)(local_29 & 1));
  std::
  function<cmCMakePresetsGraph::ReadFileResult_((anonymous_namespace)::RootPresets_&,_const_Json::Value_*)>
  ::~function(&local_50);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }